

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O0

void __thiscall
ASDCP::MXF::
FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
::Dump(FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
       *this,FILE *stream,ui32_t depth)

{
  bool bVar1;
  reference this_00;
  char *pcVar2;
  __normal_iterator<ASDCP::MXF::IndexTableSegment::DeltaEntry_*,_std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
  local_c8;
  __normal_iterator<ASDCP::MXF::IndexTableSegment::DeltaEntry_*,_std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
  local_c0;
  DeltaEntry *local_b8;
  __normal_iterator<const_ASDCP::MXF::IndexTableSegment::DeltaEntry_*,_std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
  local_b0;
  const_iterator i;
  char identbuf [128];
  FILE *pFStack_18;
  ui32_t depth_local;
  FILE *stream_local;
  FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
  *this_local;
  
  pFStack_18 = (FILE *)stream;
  if (stream == (FILE *)0x0) {
    pFStack_18 = _stderr;
  }
  __gnu_cxx::
  __normal_iterator<const_ASDCP::MXF::IndexTableSegment::DeltaEntry_*,_std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
  ::__normal_iterator(&local_b0);
  local_c0._M_current =
       (DeltaEntry *)
       std::
       vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
       ::begin(&this->
                super_vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
              );
  __gnu_cxx::
  __normal_iterator<ASDCP::MXF::IndexTableSegment::DeltaEntry_const*,std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>>>
  ::__normal_iterator<ASDCP::MXF::IndexTableSegment::DeltaEntry*>
            ((__normal_iterator<ASDCP::MXF::IndexTableSegment::DeltaEntry_const*,std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>>>
              *)&local_b8,&local_c0);
  local_b0._M_current = local_b8;
  while( true ) {
    local_c8._M_current =
         (DeltaEntry *)
         std::
         vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
         ::end(&this->
                super_vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
              );
    bVar1 = __gnu_cxx::operator!=(&local_b0,&local_c8);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_ASDCP::MXF::IndexTableSegment::DeltaEntry_*,_std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
              ::operator*(&local_b0);
    pcVar2 = IndexTableSegment::DeltaEntry::EncodeString(this_00,(char *)&i,0x80);
    fprintf(pFStack_18,"  %s\n",pcVar2);
    __gnu_cxx::
    __normal_iterator<const_ASDCP::MXF::IndexTableSegment::DeltaEntry_*,_std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
    ::operator++(&local_b0);
  }
  return;
}

Assistant:

void Dump(FILE* stream = 0, ui32_t depth = 0) {
	    (void) depth;
	    char identbuf[IdentBufferLen];

	    if ( stream == 0 )
	      {
		stream = stderr;
	      }
	    
	    typename ContainerType::const_iterator i;
	    for ( i = this->begin(); i != this->end(); ++i )
	      {
		fprintf(stream, "  %s\n", (*i).EncodeString(identbuf, IdentBufferLen));
	      }
	  }